

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colony.cpp
# Opt level: O2

void __thiscall Colony::~Colony(Colony *this)

{
  ostream *poVar1;
  double **ppdVar2;
  int i;
  long lVar3;
  
  (this->super_Graph)._vptr_Graph = (_func_int **)&PTR__Colony_00109d50;
  poVar1 = std::operator<<((ostream *)&std::cout,"destructor!!");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar3 = 0; ppdVar2 = this->phero_matrix, lVar3 < (this->super_Graph).num_node;
      lVar3 = lVar3 + 1) {
    if (ppdVar2[lVar3] != (double *)0x0) {
      operator_delete__(ppdVar2[lVar3]);
      ppdVar2 = this->phero_matrix;
    }
    ppdVar2[lVar3] = (double *)0x0;
    ppdVar2 = this->etha_matrix;
    if (ppdVar2[lVar3] != (double *)0x0) {
      operator_delete__(ppdVar2[lVar3]);
      ppdVar2 = this->etha_matrix;
    }
    ppdVar2[lVar3] = (double *)0x0;
  }
  if (ppdVar2 != (double **)0x0) {
    operator_delete__(ppdVar2);
  }
  this->phero_matrix = (double **)0x0;
  if (this->etha_matrix != (double **)0x0) {
    operator_delete__(this->etha_matrix);
  }
  this->etha_matrix = (double **)0x0;
  Graph::~Graph(&this->super_Graph);
  return;
}

Assistant:

Colony::~Colony()
{ 
	std::cout << "destructor!!" << std::endl;
	for(int i = 0; i < num_node; i++){
		delete[] phero_matrix[i];
		phero_matrix[i] = nullptr;
		delete[] etha_matrix[i];
		etha_matrix[i] = nullptr;
	}
	delete[] phero_matrix;
	phero_matrix = nullptr;
	delete[] etha_matrix;
	etha_matrix = nullptr;
}